

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

int aes_init(aes_context *ctx,uint8_t *key,int bits)

{
  uint uVar1;
  int iVar2;
  uint32_t *puVar3;
  size_t i;
  long lVar4;
  uint uVar5;
  
  if (bits == 0x80) {
    iVar2 = 10;
  }
  else {
    if (bits != 0x100) {
      return -1;
    }
    iVar2 = 0xe;
  }
  ctx->nr = iVar2;
  puVar3 = ctx->key;
  if (bits == 0x100) {
    uVar1 = *(uint *)key;
    ctx->key[0] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)(key + 4);
    ctx->key[1] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)(key + 8);
    ctx->key[2] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)(key + 0xc);
    ctx->key[3] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)(key + 0x10);
    ctx->key[4] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)(key + 0x14);
    ctx->key[5] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)(key + 0x18);
    ctx->key[6] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)(key + 0x1c);
    ctx->key[7] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    lVar4 = 0;
    do {
      uVar1 = puVar3[7];
      uVar5 = (uint)rcon[lVar4] << 0x18 ^
              ((uint)Te[uVar1 >> 0x18] |
              (uint)Te[uVar1 & 0xff] << 8 |
              (uint)Te[uVar1 >> 8 & 0xff] << 0x10 | (uint)Te[uVar1 >> 0x10 & 0xff] << 0x18) ^
              *puVar3;
      puVar3[8] = uVar5;
      uVar5 = uVar5 ^ puVar3[1];
      puVar3[9] = uVar5;
      uVar5 = uVar5 ^ puVar3[2];
      puVar3[10] = uVar5;
      uVar5 = uVar5 ^ puVar3[3];
      puVar3[0xb] = uVar5;
      uVar5 = ((uint)Te[uVar5 & 0xff] |
              (uint)Te[uVar5 >> 8 & 0xff] << 8 |
              (uint)Te[uVar5 >> 0x10 & 0xff] << 0x10 | (uint)Te[uVar5 >> 0x18] << 0x18) ^ puVar3[4];
      puVar3[0xc] = uVar5;
      uVar5 = uVar5 ^ puVar3[5];
      puVar3[0xd] = uVar5;
      uVar5 = uVar5 ^ puVar3[6];
      puVar3[0xe] = uVar5;
      puVar3[0xf] = uVar5 ^ uVar1;
      puVar3 = puVar3 + 8;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 7);
  }
  else if (bits == 0x80) {
    uVar1 = *(uint *)key;
    ctx->key[0] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)(key + 4);
    ctx->key[1] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)(key + 8);
    ctx->key[2] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)(key + 0xc);
    ctx->key[3] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    lVar4 = 0;
    do {
      uVar1 = puVar3[3];
      uVar5 = (uint)rcon[lVar4] << 0x18 ^
              ((uint)Te[uVar1 >> 0x18] |
              (uint)Te[uVar1 & 0xff] << 8 |
              (uint)Te[uVar1 >> 8 & 0xff] << 0x10 | (uint)Te[uVar1 >> 0x10 & 0xff] << 0x18) ^
              *puVar3;
      puVar3[4] = uVar5;
      uVar5 = uVar5 ^ puVar3[1];
      puVar3[5] = uVar5;
      uVar5 = uVar5 ^ puVar3[2];
      puVar3[6] = uVar5;
      puVar3[7] = uVar5 ^ uVar1;
      puVar3 = puVar3 + 4;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 10);
  }
  return 0;
}

Assistant:

int aes_init(aes_context* ctx, const uint8_t* key, int bits)
{
    switch(bits) {
        case 128: ctx->nr = 10; break;
        case 256: ctx->nr = 14; break;
        default: return -1;
    }
#if PLATFORM_SUPPORTS_AESNI
    if (aes_supported_x86())
    {
        aes_init_x86(ctx, key);
        return 0;
    }
#endif

    uint32_t* ekey = ctx->key;
    switch(bits) {
        case 128:
            ekey[0] = get32be(key +  0);
            ekey[1] = get32be(key +  4);
            ekey[2] = get32be(key +  8);
            ekey[3] = get32be(key + 12);

            for (size_t i=0; i<10; i++)
            {
                ekey[4] = ekey[0] ^ setup_mix(ekey[3]) ^ (rcon[i] << 24);
                ekey[5] = ekey[1] ^ ekey[4];
                ekey[6] = ekey[2] ^ ekey[5];
                ekey[7] = ekey[3] ^ ekey[6];
                ekey += 4;
            }
            break;
        case 256:
            ekey[0] = get32be(key +  0);
            ekey[1] = get32be(key +  4);
            ekey[2] = get32be(key +  8);
            ekey[3] = get32be(key + 12);
            ekey[4] = get32be(key + 16);
            ekey[5] = get32be(key + 20);
            ekey[6] = get32be(key + 24);
            ekey[7] = get32be(key + 28);

            for (size_t i=0; i<7; i++)
            {
                ekey[8]  = ekey[0] ^ setup_mix(ekey[7]) ^ (rcon[i] << 24);
                ekey[9]  = ekey[1] ^ ekey[8];
                ekey[10] = ekey[2] ^ ekey[9];
                ekey[11] = ekey[3] ^ ekey[10];
                ekey[12] = ekey[4] ^ setup_mix3(ekey[11]);
                ekey[13] = ekey[5] ^ ekey[12];
                ekey[14] = ekey[6] ^ ekey[13];
                ekey[15] = ekey[7] ^ ekey[14];
                ekey += 8;
            }
            break;
    }

    return 0;
}